

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd_feature.c
# Opt level: O0

int cmd_feature_dep(yl_opt *yo,int posc)

{
  int iVar1;
  int posc_local;
  yl_opt *yo_local;
  
  iVar1 = ly_out_new_file(_stdout,&yo->out);
  if (iVar1 == 0) {
    yo->out_stdout = '\x01';
    if (((yo->interactive == '\0') || (yo->feature_print_all != '\0')) || (posc != 0)) {
      yo_local._4_4_ = 0;
    }
    else {
      yl_log('\x01',"Missing modules to print.");
      yo_local._4_4_ = 1;
    }
  }
  else {
    yl_log('\x01',"Unable to print to the standard output.");
    yo_local._4_4_ = 1;
  }
  return yo_local._4_4_;
}

Assistant:

int
cmd_feature_dep(struct yl_opt *yo, int posc)
{
    if (ly_out_new_file(stdout, &yo->out)) {
        YLMSG_E("Unable to print to the standard output.");
        return 1;
    }
    yo->out_stdout = 1;

    if (yo->interactive && !yo->feature_print_all && !posc) {
        YLMSG_E("Missing modules to print.");
        return 1;
    }

    return 0;
}